

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

ssize_t ssl_cf_send(Curl_cfilter *cf,Curl_easy *data,void *buf,size_t blen,_Bool eos,CURLcode *err)

{
  CURLcode CVar1;
  _Bool local_59;
  PslCache *pPStack_58;
  _Bool done;
  ssize_t early_written;
  ssize_t nwritten;
  cf_call_data save;
  ssl_connect_data *connssl;
  CURLcode *err_local;
  size_t sStack_28;
  _Bool eos_local;
  size_t blen_local;
  void *buf_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  save.data = (Curl_easy *)cf->ctx;
  early_written = 0;
  pPStack_58 = (PslCache *)0x0;
  *err = CURLE_OK;
  nwritten = *(ssize_t *)((long)cf->ctx + 0x48);
  *(Curl_easy **)((long)cf->ctx + 0x48) = data;
  if ((int)((save.data)->req).size == 1) {
    local_59 = false;
    CVar1 = ssl_cf_connect_deferred(cf,data,buf,blen,&local_59);
    *err = CVar1;
    if (*err != CURLE_OK) {
      early_written = -1;
      goto LAB_001bc547;
    }
    if ((local_59 & 1U) == 0) {
      *err = CURLE_AGAIN;
      early_written = -1;
      goto LAB_001bc547;
    }
  }
  sStack_28 = blen;
  blen_local = (size_t)buf;
  if ((save.data)->psl != (PslCache *)0x0) {
    if (blen <= (save.data)->psl) {
      (save.data)->psl = (PslCache *)((long)(save.data)->psl - blen);
      *err = CURLE_OK;
      early_written = blen;
      goto LAB_001bc547;
    }
    pPStack_58 = (save.data)->psl;
    blen_local = (long)buf + (long)(save.data)->psl;
    sStack_28 = blen - (long)(save.data)->psl;
    (save.data)->psl = (PslCache *)0x0;
  }
  if (sStack_28 != 0) {
    early_written = (**(code **)(*(long *)save.data + 0xb0))(cf,data,blen_local,sStack_28,err);
  }
  if (-1 < early_written) {
    early_written = (long)&pPStack_58->psl + early_written;
  }
LAB_001bc547:
  *(ssize_t *)((long)cf->ctx + 0x48) = nwritten;
  return early_written;
}

Assistant:

static ssize_t ssl_cf_send(struct Curl_cfilter *cf,
                           struct Curl_easy *data,
                           const void *buf, size_t blen,
                           bool eos, CURLcode *err)
{
  struct ssl_connect_data *connssl = cf->ctx;
  struct cf_call_data save;
  ssize_t nwritten = 0, early_written = 0;

  (void)eos;
  *err = CURLE_OK;
  CF_DATA_SAVE(save, cf, data);

  if(connssl->state == ssl_connection_deferred) {
    bool done = FALSE;
    *err = ssl_cf_connect_deferred(cf, data, buf, blen, &done);
    if(*err) {
      nwritten = -1;
      goto out;
    }
    else if(!done) {
      *err = CURLE_AGAIN;
      nwritten = -1;
      goto out;
    }
    DEBUGASSERT(connssl->state == ssl_connection_complete);
  }

  if(connssl->earlydata_skip) {
    if(connssl->earlydata_skip >= blen) {
      connssl->earlydata_skip -= blen;
      *err = CURLE_OK;
      nwritten = (ssize_t)blen;
      goto out;
    }
    else {
      early_written = connssl->earlydata_skip;
      buf = ((const char *)buf) + connssl->earlydata_skip;
      blen -= connssl->earlydata_skip;
      connssl->earlydata_skip = 0;
    }
  }

  /* OpenSSL and maybe other TLS libs do not like 0-length writes. Skip. */
  if(blen > 0)
    nwritten = connssl->ssl_impl->send_plain(cf, data, buf, blen, err);

  if(nwritten >= 0)
    nwritten += early_written;

out:
  CF_DATA_RESTORE(cf, save);
  return nwritten;
}